

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_ClippingPlane::Read(ON_ClippingPlane *this,ON_BinaryArchive *file)

{
  ON_UUID uuid;
  ON_UUID uuid_00;
  bool bVar1;
  ON_ClippingPlaneData *pOVar2;
  ON_ClippingPlaneData *data_2;
  int local_a0;
  int iStack_9c;
  bool exclusion;
  int layer_index;
  int i_1;
  ON_ClippingPlaneData *data_1;
  int count_1;
  undefined1 local_84 [12];
  undefined1 auStack_78 [4];
  int i;
  ON_UUID object_id;
  ON_ClippingPlaneData *data;
  int count;
  uchar itemid;
  double d;
  undefined1 local_44 [16];
  ON_UUID viewport_id;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_ClippingPlane *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_24 = 0;
  viewport_id.Data4[4] = '\0';
  viewport_id.Data4[5] = '\0';
  viewport_id.Data4[6] = '\0';
  viewport_id.Data4[7] = '\0';
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,
                     (int *)(viewport_id.Data4 + 4));
  if (!bVar1) {
    return false;
  }
  viewport_id.Data4[3] = iStack_24 == 1;
  if (((bool)viewport_id.Data4[3]) &&
     (viewport_id.Data4[3] = ON_BinaryArchive::ReadUuid(_minor_version,(ON_UUID *)(local_44 + 8)),
     (bool)viewport_id.Data4[3])) {
    if (viewport_id.Data4._4_4_ == 0) {
      stack0xffffffffffffffb4 = local_44._8_8_;
      local_44._0_4_ = viewport_id.Data1;
      local_44._4_2_ = viewport_id.Data2;
      local_44._6_2_ = viewport_id.Data3;
      uuid_00.Data4 = (uchar  [8])viewport_id._0_8_;
      uuid_00.Data1 = local_44._8_4_;
      uuid_00.Data2 = local_44._12_2_;
      uuid_00.Data3 = local_44._14_2_;
      ON_UuidList::AddUuid(&this->m_viewport_ids,uuid_00,true);
    }
    viewport_id.Data4[3] = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_plane_id);
    if (((((bool)viewport_id.Data4[3]) &&
         (viewport_id.Data4[3] = ON_BinaryArchive::ReadPlane(_minor_version,&this->m_plane),
         (bool)viewport_id.Data4[3])) &&
        (viewport_id.Data4[3] = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bEnabled),
        (bool)viewport_id.Data4[3])) &&
       (((int)viewport_id.Data4._4_4_ < 1 ||
        (viewport_id.Data4[3] = ON_UuidList::Read(&this->m_viewport_ids,_minor_version),
        (bool)viewport_id.Data4[3])))) {
      if (1 < (int)viewport_id.Data4._4_4_) {
        _count = -1.0;
        viewport_id.Data4[3] = ON_BinaryArchive::ReadDouble(_minor_version,(double *)&count);
        if (!(bool)viewport_id.Data4[3]) goto LAB_007cb0aa;
        if ((int)viewport_id.Data4._4_4_ < 4) {
          if ((_count < 0.0) || ((_count == 1.2343210235867887e+38 && (!NAN(_count))))) {
            this->m_depth_enabled = false;
            _count = 0.0;
          }
          else {
            this->m_depth_enabled = true;
          }
        }
        SetDepth(this,_count);
      }
      if ((((int)viewport_id.Data4._4_4_ < 4) ||
          (viewport_id.Data4[3] = ON_BinaryArchive::ReadBool(_minor_version,&this->m_depth_enabled),
          (bool)viewport_id.Data4[3])) && (4 < (int)viewport_id.Data4._4_4_)) {
        data._7_1_ = 0xff;
        viewport_id.Data4[3] =
             ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&data + 7));
        if (((bool)viewport_id.Data4[3]) && (data._7_1_ != 0)) {
          if (data._7_1_ == 10) {
            data._0_4_ = 0;
            viewport_id.Data4[3] = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&data);
            if (!(bool)viewport_id.Data4[3]) goto LAB_007cb0aa;
            object_id.Data4 = (uchar  [8])GetClippingPlaneData(&this->m_data_store,true);
            auStack_78 = (undefined1  [4])0x0;
            i._0_2_ = 0;
            i._2_2_ = 0;
            object_id._0_8_ = (uchar  [8])0x0;
            local_84._8_4_ = 0;
            while (((int)local_84._8_4_ < (int)data &&
                   (viewport_id.Data4[3] =
                         ON_BinaryArchive::Read3dmReferencedComponentId
                                   (_minor_version,ModelGeometry,(ON_UUID *)auStack_78),
                   (bool)viewport_id.Data4[3]))) {
              if (object_id.Data4 != (uchar  [8])0x0) {
                data_1._4_4_ = (uint)auStack_78;
                count_1._0_2_ = (unsigned_short)i;
                count_1._2_2_ = i._2_2_;
                local_84._0_4_ = object_id.Data1;
                local_84._4_2_ = object_id.Data2;
                local_84._6_2_ = object_id.Data3;
                uuid.Data4 = (uchar  [8])object_id._0_8_;
                uuid.Data1 = (uint)auStack_78;
                uuid.Data2 = (unsigned_short)i;
                uuid.Data3 = i._2_2_;
                ON_UuidList::AddUuid((ON_UuidList *)((long)object_id.Data4 + 0x10),uuid,true);
              }
              local_84._8_4_ = local_84._8_4_ + 1;
            }
            if ((((viewport_id.Data4[3] & 1) == 0) ||
                (viewport_id.Data4[3] =
                      ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&data + 7)),
                !(bool)viewport_id.Data4[3])) || (data._7_1_ == 0)) goto LAB_007cb0aa;
          }
          if (data._7_1_ == 0xb) {
            data_1._0_4_ = 0;
            viewport_id.Data4[3] = ON_BinaryArchive::ReadInt(_minor_version,(ON__INT32 *)&data_1);
            if (!(bool)viewport_id.Data4[3]) goto LAB_007cb0aa;
            _layer_index = GetClippingPlaneData(&this->m_data_store,true);
            for (iStack_9c = 0; iStack_9c < (int)data_1; iStack_9c = iStack_9c + 1) {
              local_a0 = 0;
              viewport_id.Data4[3] =
                   ON_BinaryArchive::Read3dmReferencedComponentIndex(_minor_version,Layer,&local_a0)
              ;
              if (!(bool)viewport_id.Data4[3]) break;
              if (_layer_index != (ON_ClippingPlaneData *)0x0) {
                ON_SimpleArray<int>::Append(&_layer_index->m_layer_list,&local_a0);
                _layer_index->m_layer_list_is_sorted = false;
              }
            }
            if ((((viewport_id.Data4[3] & 1) == 0) ||
                (viewport_id.Data4[3] =
                      ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&data + 7)),
                !(bool)viewport_id.Data4[3])) || (data._7_1_ == 0)) goto LAB_007cb0aa;
          }
          if (data._7_1_ == 0xc) {
            data_2._7_1_ = 1;
            viewport_id.Data4[3] =
                 ON_BinaryArchive::ReadBool(_minor_version,(bool *)((long)&data_2 + 7));
            if (!(bool)viewport_id.Data4[3]) goto LAB_007cb0aa;
            pOVar2 = GetClippingPlaneData(&this->m_data_store,true);
            if (pOVar2 != (ON_ClippingPlaneData *)0x0) {
              pOVar2->m_is_exclusion_list = (bool)(data_2._7_1_ & 1);
            }
            viewport_id.Data4[3] =
                 ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&data + 7));
            if ((!(bool)viewport_id.Data4[3]) || (data._7_1_ == 0)) goto LAB_007cb0aa;
          }
          if (((data._7_1_ != 0xd) ||
              (((viewport_id.Data4[3] =
                      ON_BinaryArchive::ReadBool
                                (_minor_version,&this->m_participation_lists_enabled),
                (bool)viewport_id.Data4[3] &&
                (viewport_id.Data4[3] =
                      ON_BinaryArchive::ReadChar(_minor_version,(ON__UINT8 *)((long)&data + 7)),
                (bool)viewport_id.Data4[3])) && (data._7_1_ != 0)))) && (0xd < data._7_1_)) {
            data._7_1_ = 0;
          }
        }
      }
    }
  }
LAB_007cb0aa:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
  if (!bVar1) {
    viewport_id.Data4[3] = '\0';
  }
  return (bool)(viewport_id.Data4[3] & 1);
}

Assistant:

bool ON_ClippingPlane::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;
  
  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    ON_UUID viewport_id;
    rc = file.ReadUuid(viewport_id);
    if(!rc) break;

    if( 0 == minor_version )
      m_viewport_ids.AddUuid( viewport_id );

    rc = file.ReadUuid(m_plane_id);
    if (!rc) break;

    rc = file.ReadPlane(m_plane);
    if (!rc) break;

    rc = file.ReadBool(&m_bEnabled);
    if (!rc) break;

    if( minor_version > 0 )
    {
      rc = m_viewport_ids.Read(file);
      if (!rc) break;
    }

    if (minor_version > 1)
    {
      double d = -1;
      rc = file.ReadDouble(&d);
      if (!rc) break;

      if (minor_version < 4)
      {
        if (d >= 0.0 && d != ON_UNSET_POSITIVE_FLOAT)
        {
          m_depth_enabled = true;
        }
        else
        {
          m_depth_enabled = false;
          d = 0.0;
        }
      }

      SetDepth(d);
    }

    if (minor_version >= 4)
    {
      rc = file.ReadBool(&m_depth_enabled);
      if (!rc) break;
    }

    if (minor_version >= 5)
    {
      unsigned char itemid = 0xFF;
      rc = file.ReadChar(&itemid);
      if (!rc) break;
      if (0 == itemid)
        break;

      if (ON_ClippingPlaneTypeCodes::ClipParticipationObjectList == itemid) // 10
      {
        int count = 0;
        rc = file.ReadInt(&count);
        if (!rc) break;

        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        ON_UUID object_id = ON_nil_uuid;
        for (int i = 0; i < count; i++)
        {
          rc = file.Read3dmReferencedComponentId(ON_ModelComponent::Type::ModelGeometry, &object_id);
          if (!rc) break;
          if (data)
            data->m_object_id_list.AddUuid(object_id);
        }
        if (!rc) break;

        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationLayerList == itemid) // 11
      {
        int count = 0;
        rc = file.ReadInt(&count);
        if (!rc) break;

        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        for (int i = 0; i < count; i++)
        {
          int layer_index = 0;
          rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, &layer_index);
          if (!rc) break;

          if (data)
          {
            data->m_layer_list.Append(layer_index);
            data->m_layer_list_is_sorted = false;
          }
        }
        if (!rc) break;

        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationIsExclusion == itemid) // 12
      {
        bool exclusion = true;
        rc = file.ReadBool(&exclusion);
        if (!rc) break;
        ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store, true);
        if (data)
          data->m_is_exclusion_list = exclusion;
        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }
      if (ON_ClippingPlaneTypeCodes::ClipParticipationEnabled == itemid) // 13
      {
        rc = file.ReadBool(&m_participation_lists_enabled);
        if (!rc) break;
        rc = file.ReadChar(&itemid);
        if (!rc || 0 == itemid) break;
      }

      if (itemid >= ON_ClippingPlaneTypeCodes::NextTypeCode)
      {
        // we are reading file written with code newer
        // than this code (minor_version > 5)
        itemid = 0;
      }

      break;
    }

    break;
  }

  if ( !file.EndRead3dmChunk() )
    rc = false;

  return rc;
}